

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O0

void gb_sound_w_internal(gb_sound_t *gb,UINT8 offset,UINT8 data)

{
  byte bVar1;
  INT8 IVar2;
  _Bool _Var3;
  UINT32 UVar4;
  INT32 IVar5;
  _Bool local_21;
  _Bool length_was_enabled_3;
  _Bool length_was_enabled_2;
  _Bool length_was_enabled_1;
  _Bool length_was_enabled;
  UINT8 old_data;
  UINT8 data_local;
  UINT8 offset_local;
  gb_sound_t *gb_local;
  
  bVar1 = gb->snd_regs[offset];
  if ((gb->snd_control).on != '\0') {
    gb->snd_regs[offset] = data;
  }
  switch(offset) {
  case '\0':
    (gb->snd_1).reg[0] = data;
    (gb->snd_1).sweep_shift = data & 7;
    IVar5 = 1;
    if ((data & 8) != 0) {
      IVar5 = -1;
    }
    (gb->snd_1).sweep_direction = IVar5;
    (gb->snd_1).sweep_time = (UINT8)((int)(data & 0x70) >> 4);
    if ((((bVar1 & 8) != 0) && ((data & 8) == 0)) && (((gb->snd_1).sweep_neg_mode_used & 1U) != 0))
    {
      (gb->snd_1).on = false;
    }
    break;
  case '\x01':
    (gb->snd_1).reg[1] = data;
    if ((gb->snd_control).on != '\0') {
      (gb->snd_1).duty = (INT8)((int)(data & 0xc0) >> 6);
    }
    (gb->snd_1).length = data & 0x3f;
    (gb->snd_1).length_counting = true;
    break;
  case '\x02':
    (gb->snd_1).reg[2] = data;
    (gb->snd_1).envelope_value = (INT8)((int)(uint)data >> 4);
    IVar2 = -1;
    if ((data & 8) != 0) {
      IVar2 = '\x01';
    }
    (gb->snd_1).envelope_direction = IVar2;
    (gb->snd_1).envelope_time = data & 7;
    _Var3 = gb_dac_enabled(&gb->snd_1);
    if (!_Var3) {
      (gb->snd_1).on = false;
    }
    break;
  case '\x03':
    (gb->snd_1).reg[3] = data;
    if (((gb->snd_1).sweep_enabled & 1U) == 0) {
      (gb->snd_1).frequency = ((gb->snd_1).reg[4] & 7) << 8 | (ushort)(gb->snd_1).reg[3];
    }
    break;
  case '\x04':
    (gb->snd_1).reg[4] = data;
    _Var3 = (gb->snd_1).length_enabled;
    (gb->snd_1).length_enabled = (data & 0x40) != 0;
    (gb->snd_1).frequency = (gb->snd_regs[4] & 7) << 8 | (ushort)(gb->snd_1).reg[3];
    if (((((_Var3 & 1U) == 0) && (((gb->snd_control).cycles & 0x2000) == 0)) &&
        (((gb->snd_1).length_counting & 1U) != 0)) && (((gb->snd_1).length_enabled & 1U) != 0)) {
      gb_tick_length(&gb->snd_1);
    }
    if ((data & 0x80) == 0) {
      if (((gb->snd_1).sweep_enabled & 1U) == 0) {
        (gb->snd_1).frequency = ((gb->snd_1).reg[4] & 7) << 8 | (ushort)(gb->snd_1).reg[3];
      }
    }
    else {
      (gb->snd_1).on = true;
      (gb->snd_1).envelope_enabled = true;
      (gb->snd_1).envelope_value = (INT8)((int)(uint)(gb->snd_1).reg[2] >> 4);
      (gb->snd_1).envelope_count = (gb->snd_1).envelope_time;
      (gb->snd_1).sweep_count = (gb->snd_1).sweep_time;
      (gb->snd_1).sweep_neg_mode_used = false;
      (gb->snd_1).signal = '\0';
      if (gb->LegacyMode != '\0') {
        (gb->snd_1).length = (gb->snd_1).reg[1] & 0x3f;
      }
      (gb->snd_1).length_counting = true;
      (gb->snd_1).frequency = ((gb->snd_1).reg[4] & 7) << 8 | (ushort)(gb->snd_1).reg[3];
      (gb->snd_1).frequency_counter = (gb->snd_1).frequency;
      (gb->snd_1).cycles_left = 0;
      (gb->snd_1).duty_count = 0;
      local_21 = true;
      if ((gb->snd_1).sweep_shift == '\0') {
        local_21 = (gb->snd_1).sweep_time != '\0';
      }
      (gb->snd_1).sweep_enabled = local_21;
      _Var3 = gb_dac_enabled(&gb->snd_1);
      if (!_Var3) {
        (gb->snd_1).on = false;
      }
      if ((gb->snd_1).sweep_shift != '\0') {
        gb_calculate_next_sweep(&gb->snd_1);
      }
      if ((((gb->snd_1).length == '\0') && (((gb->snd_1).length_enabled & 1U) != 0)) &&
         (((gb->snd_control).cycles & 0x2000) == 0)) {
        gb_tick_length(&gb->snd_1);
      }
    }
    break;
  case '\x06':
    (gb->snd_2).reg[1] = data;
    if ((gb->snd_control).on != '\0') {
      (gb->snd_2).duty = (INT8)((int)(data & 0xc0) >> 6);
    }
    (gb->snd_2).length = data & 0x3f;
    (gb->snd_2).length_counting = true;
    break;
  case '\a':
    (gb->snd_2).reg[2] = data;
    (gb->snd_2).envelope_value = (INT8)((int)(uint)data >> 4);
    IVar2 = -1;
    if ((data & 8) != 0) {
      IVar2 = '\x01';
    }
    (gb->snd_2).envelope_direction = IVar2;
    (gb->snd_2).envelope_time = data & 7;
    _Var3 = gb_dac_enabled(&gb->snd_2);
    if (!_Var3) {
      (gb->snd_2).on = false;
    }
    break;
  case '\b':
    (gb->snd_2).reg[3] = data;
    (gb->snd_2).frequency = ((gb->snd_2).reg[4] & 7) << 8 | (ushort)(gb->snd_2).reg[3];
    break;
  case '\t':
    (gb->snd_2).reg[4] = data;
    _Var3 = (gb->snd_2).length_enabled;
    (gb->snd_2).length_enabled = (data & 0x40) != 0;
    if ((((_Var3 & 1U) == 0) && (((gb->snd_control).cycles & 0x2000) == 0)) &&
       ((((gb->snd_2).length_counting & 1U) != 0 && (((gb->snd_2).length_enabled & 1U) != 0)))) {
      gb_tick_length(&gb->snd_2);
    }
    if ((data & 0x80) == 0) {
      (gb->snd_2).frequency = ((gb->snd_2).reg[4] & 7) << 8 | (ushort)(gb->snd_2).reg[3];
    }
    else {
      (gb->snd_2).on = true;
      (gb->snd_2).envelope_enabled = true;
      (gb->snd_2).envelope_value = (INT8)((int)(uint)(gb->snd_2).reg[2] >> 4);
      (gb->snd_2).envelope_count = (gb->snd_2).envelope_time;
      (gb->snd_2).frequency = ((gb->snd_2).reg[4] & 7) << 8 | (ushort)(gb->snd_2).reg[3];
      (gb->snd_2).frequency_counter = (gb->snd_2).frequency;
      (gb->snd_2).cycles_left = 0;
      (gb->snd_2).duty_count = 0;
      (gb->snd_2).signal = '\0';
      if (gb->LegacyMode != '\0') {
        (gb->snd_2).length = (gb->snd_2).reg[1] & 0x3f;
      }
      (gb->snd_2).length_counting = true;
      _Var3 = gb_dac_enabled(&gb->snd_2);
      if (!_Var3) {
        (gb->snd_2).on = false;
      }
      if ((((gb->snd_2).length == '\0') && (((gb->snd_2).length_enabled & 1U) != 0)) &&
         (((gb->snd_control).cycles & 0x2000) == 0)) {
        gb_tick_length(&gb->snd_2);
      }
    }
    break;
  case '\n':
    (gb->snd_3).reg[0] = data;
    _Var3 = gb_dac_enabled(&gb->snd_3);
    if (_Var3) {
      if (gb->LegacyMode != '\0') {
        (gb->snd_3).on = true;
      }
    }
    else {
      (gb->snd_3).on = false;
    }
    break;
  case '\v':
    (gb->snd_3).reg[1] = data;
    (gb->snd_3).length = data;
    (gb->snd_3).length_counting = true;
    break;
  case '\f':
    (gb->snd_3).reg[2] = data;
    (gb->snd_3).level = (UINT8)((int)(data & 0x60) >> 5);
    break;
  case '\r':
    (gb->snd_3).reg[3] = data;
    (gb->snd_3).frequency = ((gb->snd_3).reg[4] & 7) << 8 | (ushort)(gb->snd_3).reg[3];
    break;
  case '\x0e':
    (gb->snd_3).reg[4] = data;
    _Var3 = (gb->snd_3).length_enabled;
    (gb->snd_3).length_enabled = (data & 0x40) != 0;
    if ((((_Var3 & 1U) == 0) && (((gb->snd_control).cycles & 0x2000) == 0)) &&
       ((((gb->snd_3).length_counting & 1U) != 0 && (((gb->snd_3).length_enabled & 1U) != 0)))) {
      gb_tick_length(&gb->snd_3);
    }
    if ((data & 0x80) == 0) {
      (gb->snd_3).frequency = ((gb->snd_3).reg[4] & 7) << 8 | (ushort)(gb->snd_3).reg[3];
    }
    else {
      if ((((gb->snd_3).on & 1U) != 0) && ((gb->snd_3).frequency_counter == 0x7ff)) {
        gb_corrupt_wave_ram(gb);
      }
      (gb->snd_3).on = true;
      (gb->snd_3).offset = '\0';
      (gb->snd_3).duty = '\x01';
      (gb->snd_3).duty_count = 0;
      if (gb->LegacyMode != '\0') {
        (gb->snd_3).length = (gb->snd_3).reg[1];
      }
      (gb->snd_3).length_counting = true;
      (gb->snd_3).frequency = ((gb->snd_3).reg[4] & 7) << 8 | (ushort)(gb->snd_3).reg[3];
      (gb->snd_3).frequency_counter = (gb->snd_3).frequency;
      (gb->snd_3).cycles_left = -6;
      (gb->snd_3).sample_reading = false;
      _Var3 = gb_dac_enabled(&gb->snd_3);
      if (!_Var3) {
        (gb->snd_3).on = false;
      }
      if ((((gb->snd_3).length == '\0') && (((gb->snd_3).length_enabled & 1U) != 0)) &&
         (((gb->snd_control).cycles & 0x2000) == 0)) {
        gb_tick_length(&gb->snd_3);
      }
    }
    break;
  case '\x10':
    (gb->snd_4).reg[1] = data;
    (gb->snd_4).length = data & 0x3f;
    (gb->snd_4).length_counting = true;
    break;
  case '\x11':
    (gb->snd_4).reg[2] = data;
    (gb->snd_4).envelope_value = (INT8)((int)(uint)data >> 4);
    IVar2 = -1;
    if ((data & 8) != 0) {
      IVar2 = '\x01';
    }
    (gb->snd_4).envelope_direction = IVar2;
    (gb->snd_4).envelope_time = data & 7;
    _Var3 = gb_dac_enabled(&gb->snd_4);
    if (!_Var3) {
      (gb->snd_4).on = false;
    }
    break;
  case '\x12':
    (gb->snd_4).reg[3] = data;
    (gb->snd_4).noise_short = (data & 8) != 0;
    break;
  case '\x13':
    (gb->snd_4).reg[4] = data;
    _Var3 = (gb->snd_4).length_enabled;
    (gb->snd_4).length_enabled = (data & 0x40) != 0;
    if (((((_Var3 & 1U) == 0) && (((gb->snd_control).cycles & 0x2000) == 0)) &&
        (((gb->snd_4).length_counting & 1U) != 0)) && (((gb->snd_4).length_enabled & 1U) != 0)) {
      gb_tick_length(&gb->snd_4);
    }
    if ((data & 0x80) != 0) {
      (gb->snd_4).on = true;
      (gb->snd_4).envelope_enabled = true;
      (gb->snd_4).envelope_value = (INT8)((int)(uint)(gb->snd_4).reg[2] >> 4);
      (gb->snd_4).envelope_count = (gb->snd_4).envelope_time;
      (gb->snd_4).frequency_counter = 0;
      UVar4 = gb_noise_period_cycles(gb);
      (gb->snd_4).cycles_left = UVar4;
      (gb->snd_4).signal = -1;
      (gb->snd_4).noise_lfsr = 0x7fff;
      if (gb->LegacyMode != '\0') {
        (gb->snd_4).length = (gb->snd_4).reg[1] & 0x3f;
      }
      (gb->snd_4).length_counting = true;
      _Var3 = gb_dac_enabled(&gb->snd_4);
      if (!_Var3) {
        (gb->snd_4).on = false;
      }
      if ((((gb->snd_4).length == '\0') && (((gb->snd_4).length_enabled & 1U) != 0)) &&
         (((gb->snd_control).cycles & 0x2000) == 0)) {
        gb_tick_length(&gb->snd_4);
      }
    }
    break;
  case '\x14':
    (gb->snd_control).vol_left = data & 7;
    (gb->snd_control).vol_right = (UINT8)((int)(data & 0x70) >> 4);
    break;
  case '\x15':
    (gb->snd_control).mode1_right = data & 1;
    (gb->snd_control).mode1_left = (UINT8)((int)(data & 0x10) >> 4);
    (gb->snd_control).mode2_right = (UINT8)((int)(data & 2) >> 1);
    (gb->snd_control).mode2_left = (UINT8)((int)(data & 0x20) >> 5);
    (gb->snd_control).mode3_right = (UINT8)((int)(data & 4) >> 2);
    (gb->snd_control).mode3_left = (UINT8)((int)(data & 0x40) >> 6);
    (gb->snd_control).mode4_right = (UINT8)((int)(data & 8) >> 3);
    (gb->snd_control).mode4_left = (UINT8)((int)(data & 0x80) >> 7);
    break;
  case '\x16':
    if ((data & 0x80) == 0) {
      gb_apu_power_off(gb);
    }
    else if ((gb->snd_control).on == '\0') {
      (gb->snd_control).cycles = (gb->snd_control).cycles | 0xe000;
    }
    (gb->snd_control).on = (data & 0x80) != 0;
    gb->snd_regs[0x16] = data & 0x80;
  }
  return;
}

Assistant:

static void gb_sound_w_internal(gb_sound_t *gb, UINT8 offset, UINT8 data)
{
	/* Store the value */
	UINT8 old_data = gb->snd_regs[offset];

	if (gb->snd_control.on)
	{
		gb->snd_regs[offset] = data;
	}

	switch (offset)
	{
	/*MODE 1 */
	case NR10: /* Sweep (R/W) */
		gb->snd_1.reg[0] = data;
		gb->snd_1.sweep_shift = data & 0x7;
		gb->snd_1.sweep_direction = (data & 0x8) ? -1 : 1;
		gb->snd_1.sweep_time = (data & 0x70) >> 4;
		if ((old_data & 0x08) && !(data & 0x08) && gb->snd_1.sweep_neg_mode_used)
		{
			gb->snd_1.on = false;
		}
		break;
	case NR11: /* Sound length/Wave pattern duty (R/W) */
		gb->snd_1.reg[1] = data;
		if (gb->snd_control.on)
		{
			gb->snd_1.duty = (data & 0xc0) >> 6;
		}
		gb->snd_1.length = data & 0x3f;
		gb->snd_1.length_counting = true;
		break;
	case NR12: /* Envelope (R/W) */
		gb->snd_1.reg[2] = data;
		gb->snd_1.envelope_value = data >> 4;
		gb->snd_1.envelope_direction = (data & 0x8) ? 1 : -1;
		gb->snd_1.envelope_time = data & 0x07;
		if (!gb_dac_enabled(&gb->snd_1))
		{
			gb->snd_1.on = false;
		}
		break;
	case NR13: /* Frequency lo (R/W) */
		gb->snd_1.reg[3] = data;
		// Only enabling the frequency line breaks blarggs's sound test #5
		// This condition may not be correct
		if (!gb->snd_1.sweep_enabled)
		{
			gb->snd_1.frequency = ((gb->snd_1.reg[4] & 0x7) << 8) | gb->snd_1.reg[3];
		}
		break;
	case NR14: /* Frequency hi / Initialize (R/W) */
		gb->snd_1.reg[4] = data;
		{
			bool length_was_enabled = gb->snd_1.length_enabled;

			gb->snd_1.length_enabled = (data & 0x40) ? true : false;
			gb->snd_1.frequency = ((gb->snd_regs[NR14] & 0x7) << 8) | gb->snd_1.reg[3];

			if (!length_was_enabled && !(gb->snd_control.cycles & FRAME_CYCLES) && gb->snd_1.length_counting)
			{
				if (gb->snd_1.length_enabled)
				{
					gb_tick_length(&gb->snd_1);
				}
			}

			if (data & 0x80)
			{
				gb->snd_1.on = true;
				gb->snd_1.envelope_enabled = true;
				gb->snd_1.envelope_value = gb->snd_1.reg[2] >> 4;
				gb->snd_1.envelope_count = gb->snd_1.envelope_time;
				gb->snd_1.sweep_count = gb->snd_1.sweep_time;
				gb->snd_1.sweep_neg_mode_used = false;
				gb->snd_1.signal = 0;
				if (gb->LegacyMode)
					gb->snd_1.length = gb->snd_1.reg[1] & 0x3f;	// VGM log fix -Valley Bell
				gb->snd_1.length_counting = true;
				gb->snd_1.frequency = ((gb->snd_1.reg[4] & 0x7) << 8) | gb->snd_1.reg[3];
				gb->snd_1.frequency_counter = gb->snd_1.frequency;
				gb->snd_1.cycles_left = 0;
				gb->snd_1.duty_count = 0;
				gb->snd_1.sweep_enabled = (gb->snd_1.sweep_shift != 0) || (gb->snd_1.sweep_time != 0);
				if (!gb_dac_enabled(&gb->snd_1))
				{
					gb->snd_1.on = false;
				}
				if (gb->snd_1.sweep_shift > 0)
				{
					gb_calculate_next_sweep(&gb->snd_1);
				}

				if (gb->snd_1.length == 0 && gb->snd_1.length_enabled && !(gb->snd_control.cycles & FRAME_CYCLES))
				{
					gb_tick_length(&gb->snd_1);
				}
			}
			else
			{
				// This condition may not be correct
				if (!gb->snd_1.sweep_enabled)
				{
					gb->snd_1.frequency = ((gb->snd_1.reg[4] & 0x7) << 8) | gb->snd_1.reg[3];
				}
			}
		}
		break;

	/*MODE 2 */
	case NR21: /* Sound length/Wave pattern duty (R/W) */
		gb->snd_2.reg[1] = data;
		if (gb->snd_control.on)
		{
			gb->snd_2.duty = (data & 0xc0) >> 6;
		}
		gb->snd_2.length = data & 0x3f;
		gb->snd_2.length_counting = true;
		break;
	case NR22: /* Envelope (R/W) */
		gb->snd_2.reg[2] = data;
		gb->snd_2.envelope_value = data >> 4;
		gb->snd_2.envelope_direction = (data & 0x8) ? 1 : -1;
		gb->snd_2.envelope_time = data & 0x07;
		if (!gb_dac_enabled(&gb->snd_2))
		{
			gb->snd_2.on = false;
		}
		break;
	case NR23: /* Frequency lo (R/W) */
		gb->snd_2.reg[3] = data;
		gb->snd_2.frequency = ((gb->snd_2.reg[4] & 0x7) << 8) | gb->snd_2.reg[3];
		break;
	case NR24: /* Frequency hi / Initialize (R/W) */
		gb->snd_2.reg[4] = data;
		{
			bool length_was_enabled = gb->snd_2.length_enabled;

			gb->snd_2.length_enabled = (data & 0x40) ? true : false;

			if (!length_was_enabled && !(gb->snd_control.cycles & FRAME_CYCLES) && gb->snd_2.length_counting)
			{
				if (gb->snd_2.length_enabled)
				{
					gb_tick_length(&gb->snd_2);
				}
			}

			if (data & 0x80)
			{
				gb->snd_2.on = true;
				gb->snd_2.envelope_enabled = true;
				gb->snd_2.envelope_value = gb->snd_2.reg[2] >> 4;
				gb->snd_2.envelope_count = gb->snd_2.envelope_time;
				gb->snd_2.frequency = ((gb->snd_2.reg[4] & 0x7) << 8) | gb->snd_2.reg[3];
				gb->snd_2.frequency_counter = gb->snd_2.frequency;
				gb->snd_2.cycles_left = 0;
				gb->snd_2.duty_count = 0;
				gb->snd_2.signal = 0;
				if (gb->LegacyMode)
					gb->snd_2.length = gb->snd_2.reg[1] & 0x3f;	// VGM log fix -Valley Bell
				gb->snd_2.length_counting = true;

				if (!gb_dac_enabled(&gb->snd_2))
				{
					gb->snd_2.on = false;
				}

				if (gb->snd_2.length == 0 && gb->snd_2.length_enabled && !(gb->snd_control.cycles & FRAME_CYCLES))
				{
					gb_tick_length(&gb->snd_2);
				}
			}
			else
			{
				gb->snd_2.frequency = ((gb->snd_2.reg[4] & 0x7) << 8) | gb->snd_2.reg[3];
			}
		}
		break;

	/*MODE 3 */
	case NR30: /* Sound On/Off (R/W) */
		gb->snd_3.reg[0] = data;
		if (!gb_dac_enabled(&gb->snd_3))
		{
			gb->snd_3.on = false;
		}
		else if (gb->LegacyMode)
			gb->snd_3.on = true;	// even more VGM log fix -Valley Bell
		break;
	case NR31: /* Sound Length (R/W) */
		gb->snd_3.reg[1] = data;
		gb->snd_3.length = data;
		gb->snd_3.length_counting = true;
		break;
	case NR32: /* Select Output Level */
		gb->snd_3.reg[2] = data;
		gb->snd_3.level = (data & 0x60) >> 5;
		break;
	case NR33: /* Frequency lo (W) */
		gb->snd_3.reg[3] = data;
		gb->snd_3.frequency = ((gb->snd_3.reg[4] & 0x7) << 8) | gb->snd_3.reg[3];
		break;
	case NR34: /* Frequency hi / Initialize (W) */
		gb->snd_3.reg[4] = data;
		{
			bool length_was_enabled = gb->snd_3.length_enabled;

			gb->snd_3.length_enabled = (data & 0x40) ? true : false;

			if (!length_was_enabled && !(gb->snd_control.cycles & FRAME_CYCLES) && gb->snd_3.length_counting)
			{
				if (gb->snd_3.length_enabled)
				{
					gb_tick_length(&gb->snd_3);
				}
			}

			if (data & 0x80)
			{
				if (gb->snd_3.on && gb->snd_3.frequency_counter == 0x7ff)
				{
					gb_corrupt_wave_ram(gb);
				}
				gb->snd_3.on = true;
				gb->snd_3.offset = 0;
				gb->snd_3.duty = 1;
				gb->snd_3.duty_count = 0;
				if (gb->LegacyMode)
					gb->snd_3.length = gb->snd_3.reg[1];	// VGM log fix -Valley Bell
				gb->snd_3.length_counting = true;
				gb->snd_3.frequency = ((gb->snd_3.reg[4] & 0x7) << 8) | gb->snd_3.reg[3];
				gb->snd_3.frequency_counter = gb->snd_3.frequency;
				// There is a tiny bit of delay in starting up the wave channel
				gb->snd_3.cycles_left = -6;
				gb->snd_3.sample_reading = false;

				if (!gb_dac_enabled(&gb->snd_3))
				{
					gb->snd_3.on = false;
				}

				if (gb->snd_3.length == 0 && gb->snd_3.length_enabled && !(gb->snd_control.cycles & FRAME_CYCLES))
				{
					gb_tick_length(&gb->snd_3);
				}
			}
			else
			{
				gb->snd_3.frequency = ((gb->snd_3.reg[4] & 0x7) << 8) | gb->snd_3.reg[3];
			}
		}
		break;

	/*MODE 4 */
	case NR41: /* Sound Length (R/W) */
		gb->snd_4.reg[1] = data;
		gb->snd_4.length = data & 0x3f;
		gb->snd_4.length_counting = true;
		break;
	case NR42: /* Envelope (R/W) */
		gb->snd_4.reg[2] = data;
		gb->snd_4.envelope_value = data >> 4;
		gb->snd_4.envelope_direction = (data & 0x8) ? 1 : -1;
		gb->snd_4.envelope_time = data & 0x07;
		if (!gb_dac_enabled(&gb->snd_4))
		{
			gb->snd_4.on = false;
		}
		break;
	case NR43: /* Polynomial Counter/Frequency */
		gb->snd_4.reg[3] = data;
		gb->snd_4.noise_short = (data & 0x8);
		break;
	case NR44: /* Counter/Consecutive / Initialize (R/W)  */
		gb->snd_4.reg[4] = data;
		{
			bool length_was_enabled = gb->snd_4.length_enabled;

			gb->snd_4.length_enabled = (data & 0x40) ? true : false;

			if (!length_was_enabled && !(gb->snd_control.cycles & FRAME_CYCLES) && gb->snd_4.length_counting)
			{
				if (gb->snd_4.length_enabled)
				{
					gb_tick_length(&gb->snd_4);
				}
			}

			if (data & 0x80)
			{
				gb->snd_4.on = true;
				gb->snd_4.envelope_enabled = true;
				gb->snd_4.envelope_value = gb->snd_4.reg[2] >> 4;
				gb->snd_4.envelope_count = gb->snd_4.envelope_time;
				gb->snd_4.frequency_counter = 0;
				gb->snd_4.cycles_left = gb_noise_period_cycles(gb);
				gb->snd_4.signal = -1;
				gb->snd_4.noise_lfsr = 0x7fff;
				if (gb->LegacyMode)
					gb->snd_4.length = gb->snd_4.reg[1] & 0x3f;	// VGM log fix -Valley Bell
				gb->snd_4.length_counting = true;

				if (!gb_dac_enabled(&gb->snd_4))
				{
					gb->snd_4.on = false;
				}

				if (gb->snd_4.length == 0 && gb->snd_4.length_enabled && !(gb->snd_control.cycles & FRAME_CYCLES))
				{
					gb_tick_length(&gb->snd_4);
				}
			}
		}
		break;

	/* CONTROL */
	case NR50: /* Channel Control / On/Off / Volume (R/W)  */
		gb->snd_control.vol_left = data & 0x7;
		gb->snd_control.vol_right = (data & 0x70) >> 4;
		break;
	case NR51: /* Selection of Sound Output Terminal */
		gb->snd_control.mode1_right = data & 0x1;
		gb->snd_control.mode1_left = (data & 0x10) >> 4;
		gb->snd_control.mode2_right = (data & 0x2) >> 1;
		gb->snd_control.mode2_left = (data & 0x20) >> 5;
		gb->snd_control.mode3_right = (data & 0x4) >> 2;
		gb->snd_control.mode3_left = (data & 0x40) >> 6;
		gb->snd_control.mode4_right = (data & 0x8) >> 3;
		gb->snd_control.mode4_left = (data & 0x80) >> 7;
		break;
	case NR52: // Sound On/Off (R/W)
		// Only bit 7 is writable, writing to bits 0-3 does NOT enable or disable sound. They are read-only.
		if (!(data & 0x80))
		{
			// On DMG the length counters are not affected and not clocked
			// powering off should actually clear all registers
			gb_apu_power_off(gb);
		}
		else
		{
			if (!gb->snd_control.on)
			{
				// When switching on, the next step should be 0.
				gb->snd_control.cycles |= 7 * FRAME_CYCLES;
			}
		}
		gb->snd_control.on = (data & 0x80) ? true : false;
		gb->snd_regs[NR52] = data & 0x80;
		break;
	}
}